

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestMembraneImpl::makeThing
          (TestMembraneImpl *this,MakeThingContext context)

{
  Own<capnp::_::(anonymous_namespace)::ThingImpl,_std::nullptr_t> local_80;
  undefined1 local_70 [24];
  CallContext<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  local_58;
  Builder local_50;
  Maybe<capnp::MessageSize> local_28;
  
  local_28.ptr.isSet = false;
  CallContext<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  ::getResults(&local_50,&local_58,&local_28);
  kj::heap<capnp::_::(anonymous_namespace)::ThingImpl,char_const(&)[7]>((char (*) [7])&local_80);
  capnproto_test::capnp::test::TestMembrane::Thing::Client::
  Client<capnp::_::(anonymous_namespace)::ThingImpl,void>((Client *)local_70,&local_80);
  capnproto_test::capnp::test::TestMembrane::MakeThingResults::Builder::setThing
            (&local_50,(Client *)local_70);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_70 + 8));
  kj::Own<capnp::_::(anonymous_namespace)::ThingImpl,_std::nullptr_t>::~Own(&local_80);
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> makeThing(MakeThingContext context) override {
    context.getResults().setThing(kj::heap<ThingImpl>("inside"));
    return kj::READY_NOW;
  }